

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppMul6(word *c,word *a,word *b,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *t;
  
  ppMul3(in_RDI,in_RSI,in_RDX,in_RCX);
  ppMul3(in_RDI + 6,in_RSI + 3,in_RDX + 3,in_RCX);
  *in_RCX = *in_RSI ^ in_RSI[3];
  in_RCX[1] = in_RSI[1] ^ in_RSI[4];
  in_RCX[2] = in_RSI[2] ^ in_RSI[5];
  in_RCX[3] = *in_RDX ^ in_RDX[3];
  in_RCX[4] = in_RDX[1] ^ in_RDX[4];
  in_RCX[5] = in_RDX[2] ^ in_RDX[5];
  in_RCX[6] = in_RDI[3] ^ in_RDI[6];
  in_RCX[7] = in_RDI[4] ^ in_RDI[7];
  in_RCX[8] = in_RDI[5] ^ in_RDI[8];
  ppMul3(in_RDI + 3,in_RCX,in_RCX + 3,in_RCX + 9);
  in_RDI[3] = *in_RDI ^ in_RCX[6] ^ in_RDI[3];
  in_RDI[4] = in_RDI[1] ^ in_RCX[7] ^ in_RDI[4];
  in_RDI[5] = in_RDI[2] ^ in_RCX[8] ^ in_RDI[5];
  in_RDI[6] = in_RDI[9] ^ in_RCX[6] ^ in_RDI[6];
  in_RDI[7] = in_RDI[10] ^ in_RCX[7] ^ in_RDI[7];
  in_RDI[8] = in_RDI[0xb] ^ in_RCX[8] ^ in_RDI[8];
  return;
}

Assistant:

static void ppMul6(word c[12], const word a[6], const word b[6], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 6, c, 12));
	ASSERT(wwIsDisjoint2(b, 6, c, 12));
	// c1 || c0 <- a0 b0
	ppMul3(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul3(c + 6, a + 3, b + 3, t);
	// t0 <- a0 + a1
	t[0] = a[0] ^ a[3];
	t[1] = a[1] ^ a[4];
	t[2] = a[2] ^ a[5];
	// t1 <- b0 + b1
	t[3] = b[0] ^ b[3];
	t[4] = b[1] ^ b[4];
	t[5] = b[2] ^ b[5];
	// t2 <- c1 + c2
	t[6] = c[3] ^ c[6];
	t[7] = c[4] ^ c[7];
	t[8] = c[5] ^ c[8];
	// c2 || c1 <- t0 t1
	ppMul3(c + 3, t, t + 3, t + 9);
	// c1 <- c1 + c0 + w2
	c[3] ^= c[0] ^ t[6];
	c[4] ^= c[1] ^ t[7];
	c[5] ^= c[2] ^ t[8];
	// c2 <- c2 + c3 + w2
	c[6] ^= c[9] ^ t[6];
	c[7] ^= c[10] ^ t[7];
	c[8] ^= c[11] ^ t[8];
}